

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O3

void __thiscall
SuiteMessageTests::TestrejectGetString::~TestrejectGetString(TestrejectGetString *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(rejectGetString)
{
  Reject object;

  object.set( RefSeqNum( 73 ) );
  object.set( Text( "This Message SUCKS!!!" ) );

  CHECK_EQUAL( "8=FIX.4.2\0019=36\00135=3\00145=73\001"
               "58=This Message SUCKS!!!\00110=029\001",
               object.toString() );
}